

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

void __thiscall
cs::allocator_type<cs_impl::any::holder<cs::structure>,_64UL,_cs_impl::default_allocator_provider>::
allocator_type(allocator_type<cs_impl::any::holder<cs::structure>,_64UL,_cs_impl::default_allocator_provider>
               *this)

{
  undefined8 uVar1;
  long lVar2;
  new_allocator<cs_impl::any::holder<cs::structure>_> *in_RDI;
  new_allocator<cs_impl::any::holder<cs::structure>_> *__n;
  undefined1 auVar3 [16];
  holder<cs::structure> *in_stack_ffffffffffffffd0;
  
  __n = in_RDI + 0x200;
  std::allocator<cs_impl::any::holder<cs::structure>_>::allocator
            ((allocator<cs_impl::any::holder<cs::structure>_> *)0x41a434);
  *(undefined8 *)(in_RDI + 0x208) = 0;
  while (uVar1 = *(undefined8 *)(in_RDI + 0x208), auVar3._8_4_ = (int)((ulong)uVar1 >> 0x20),
        auVar3._0_8_ = uVar1, auVar3._12_4_ = 0x45300000,
        (auVar3._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0) < 32.0) {
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::new_allocator<cs_impl::any::holder<cs::structure>_>::allocate
                   (in_RDI,(size_type)__n,in_stack_ffffffffffffffd0);
    lVar2 = *(long *)(in_RDI + 0x208);
    *(long *)(in_RDI + 0x208) = lVar2 + 1;
    *(holder<cs::structure> **)(in_RDI + lVar2 * 8) = in_stack_ffffffffffffffd0;
  }
  return;
}

Assistant:

allocator_type()
		{
			while (mOffset < 0.5 * blck_size)
				mPool[mOffset++] = mAlloc.allocate(1);
		}